

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

Result __thiscall
soplex::SPxMainSM<double>::aggregateVars
          (SPxMainSM<double> *this,SPxLPBase<double> *lp,SVectorBase<double> *row,int *i)

{
  uint uVar1;
  double dVar2;
  shared_ptr<soplex::Tolerances> *psVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  double *pdVar7;
  char *pcVar8;
  element_type *peVar9;
  undefined8 uVar10;
  SPxMainSM<double> *lp_00;
  int *piVar11;
  uint *in_RCX;
  int __c;
  int __c_00;
  int __c_01;
  element_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RSI;
  SPxMainSM<double> *in_RDI;
  Real RVar12;
  Real RVar13;
  SPxLPBase<double> *lp_01;
  double dVar14;
  double dVar15;
  double eps;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr;
  double oldupper_k;
  double oldlower_k;
  double z2;
  double z1;
  double scale2;
  double scale1;
  double obj_k;
  double obj_j;
  double ark;
  int pos_rk;
  double newcoef;
  double rhs_r;
  double lhs_r;
  double arj;
  int row_r;
  int r;
  double aggr_const;
  double aggr_coef;
  SVectorBase<double> *col_k;
  SVectorBase<double> *col_j;
  double _upper_j;
  double _lower_j;
  double _aij;
  int _j;
  bool flip_jk;
  double new_up_k;
  double new_lo_k;
  double new_up_j;
  double new_lo_j;
  double upper_k;
  double lower_k;
  double upper_j;
  double lower_j;
  double aik;
  double aij;
  int k;
  int j;
  double rhs;
  double in_stack_fffffffffffffae8;
  AggregationPS *__p;
  SPxLPBase<double> *in_stack_fffffffffffffaf0;
  SPxLPBase<double> *this_00;
  SVectorBase<double> *in_stack_fffffffffffffaf8;
  SPxLPBase<double> *in_stack_fffffffffffffb00;
  SPxMainSM<double> *this_01;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  double local_498;
  double local_488;
  double local_478;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffffb90;
  double in_stack_fffffffffffffb98;
  double in_stack_fffffffffffffba0;
  double dVar16;
  AggregationPS *in_stack_fffffffffffffbc0;
  bool local_3f2;
  bool local_39a;
  bool local_34a;
  double local_2f8;
  double local_2e8;
  double local_2d8;
  double local_2c8;
  double local_2b8;
  double local_2a8;
  double local_298;
  double local_288;
  allocator local_211;
  string local_210 [32];
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  SPxLPBase<double> *local_1c0;
  double local_1b8;
  int local_1ac;
  double local_1a8;
  double local_1a0;
  double local_198;
  AggregationPS *local_190;
  double local_188;
  double local_180;
  uint local_178;
  uint local_174;
  double local_170;
  double local_168;
  SVectorBase<double> *local_160;
  SVectorBase<double> *local_158;
  double local_150;
  shared_ptr<soplex::Tolerances> *local_148;
  double local_140;
  uint local_138;
  byte local_131;
  byte local_109;
  byte local_e1;
  bool local_be;
  undefined1 local_bd;
  allocator local_a9;
  string local_a8 [32];
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  shared_ptr<soplex::Tolerances> *local_60;
  double local_58;
  shared_ptr<soplex::Tolerances> *local_50;
  double local_48;
  double local_40;
  undefined1 local_38 [16];
  uint *local_28;
  element_type *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  Result local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18._M_pi = in_RSI;
  pdVar7 = SPxLPBase<double>::rhs
                     (in_stack_fffffffffffffaf0,(int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
  local_38._8_8_ = *pdVar7;
  pcVar8 = SVectorBase<double>::index((SVectorBase<double> *)local_20,(char *)0x0,__c);
  local_38._4_4_ = SUB84(pcVar8,0);
  pcVar8 = SVectorBase<double>::index((SVectorBase<double> *)local_20,(char *)0x1,__c_00);
  local_38._0_4_ = SUB84(pcVar8,0);
  pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)local_20,0);
  local_40 = *pdVar7;
  pdVar7 = SVectorBase<double>::value((SVectorBase<double> *)local_20,1);
  local_48 = *pdVar7;
  pdVar7 = SPxLPBase<double>::lower
                     (in_stack_fffffffffffffaf0,(int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
  local_50 = (shared_ptr<soplex::Tolerances> *)*pdVar7;
  pdVar7 = SPxLPBase<double>::upper
                     (in_stack_fffffffffffffaf0,(int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
  local_58 = *pdVar7;
  pdVar7 = SPxLPBase<double>::lower
                     (in_stack_fffffffffffffaf0,(int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
  local_60 = (shared_ptr<soplex::Tolerances> *)*pdVar7;
  pdVar7 = SPxLPBase<double>::upper
                     (in_stack_fffffffffffffaf0,(int)((ulong)in_stack_fffffffffffffae8 >> 0x20));
  local_68 = *pdVar7;
  feastol((SPxMainSM<double> *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  bVar5 = EQrel<double,double,double>
                    ((double)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                     1.29695986932236e-317);
  if (!bVar5) {
    feastol((SPxMainSM<double> *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    bVar5 = EQrel<double,double,double>
                      ((double)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                       1.29699890050838e-317);
    if (!bVar5) {
      __p = (AggregationPS *)local_38;
      this_00 = (SPxLPBase<double> *)(local_38 + 8);
      SPxOut::
      debug<soplex::SPxMainSM<double>,_const_char_(&)[62],_int_&,_double_&,_int_&,_double_&,_int_&,_double_&,_0>
                (in_RDI,(char (*) [62])
                        "IMAISM23 row {}: doubleton equation -> {} x_{} + {} x_{} = {}",
                 (int *)local_28,&local_40,(int *)(local_38 + 4),&local_48,(int *)__p,
                 (double *)this_00);
      psVar3 = local_60;
      dVar14 = local_68;
      if (0.0 <= local_40 * local_48) {
        if (local_40 * local_48 <= 0.0) {
          local_bd = 1;
          uVar10 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a8,"XMAISM12 This should never happen.",&local_a9);
          SPxInternalCodeException::SPxInternalCodeException
                    ((SPxInternalCodeException *)this_00,(string *)__p);
          local_bd = 0;
          __cxa_throw(uVar10,&SPxInternalCodeException::typeinfo,
                      SPxInternalCodeException::~SPxInternalCodeException);
        }
        pdVar7 = (double *)infinity();
        if (-*pdVar7 < (double)psVar3) {
          local_2c8 = ((double)local_38._8_8_ - local_48 * (double)local_60) / local_40;
        }
        else {
          pdVar7 = (double *)infinity();
          local_2c8 = -*pdVar7;
        }
        dVar14 = local_68;
        local_70 = local_2c8;
        pdVar7 = (double *)infinity();
        if (dVar14 < *pdVar7) {
          local_2d8 = ((double)local_38._8_8_ - local_48 * local_68) / local_40;
        }
        else {
          pdVar7 = (double *)infinity();
          local_2d8 = *pdVar7;
        }
        psVar3 = local_50;
        local_78 = local_2d8;
        pdVar7 = (double *)infinity();
        if (-*pdVar7 < (double)psVar3) {
          local_2e8 = ((double)local_38._8_8_ - local_40 * (double)local_50) / local_48;
        }
        else {
          pdVar7 = (double *)infinity();
          local_2e8 = -*pdVar7;
        }
        dVar14 = local_58;
        local_80 = local_2e8;
        pdVar7 = (double *)infinity();
        if (dVar14 < *pdVar7) {
          local_2f8 = ((double)local_38._8_8_ - local_40 * local_58) / local_48;
        }
        else {
          pdVar7 = (double *)infinity();
          local_2f8 = *pdVar7;
        }
        local_88 = local_2f8;
      }
      else {
        pdVar7 = (double *)infinity();
        if (dVar14 < *pdVar7) {
          local_288 = ((double)local_38._8_8_ - local_48 * local_68) / local_40;
        }
        else {
          pdVar7 = (double *)infinity();
          local_288 = -*pdVar7;
        }
        psVar3 = local_60;
        local_70 = local_288;
        pdVar7 = (double *)infinity();
        if (-*pdVar7 < (double)psVar3) {
          local_298 = ((double)local_38._8_8_ - local_48 * (double)local_60) / local_40;
        }
        else {
          pdVar7 = (double *)infinity();
          local_298 = *pdVar7;
        }
        dVar14 = local_58;
        local_78 = local_298;
        pdVar7 = (double *)infinity();
        if (dVar14 < *pdVar7) {
          local_2a8 = ((double)local_38._8_8_ - local_40 * local_58) / local_48;
        }
        else {
          pdVar7 = (double *)infinity();
          local_2a8 = -*pdVar7;
        }
        psVar3 = local_50;
        local_80 = local_2a8;
        pdVar7 = (double *)infinity();
        if (-*pdVar7 < (double)psVar3) {
          local_2b8 = ((double)local_38._8_8_ - local_40 * (double)local_50) / local_48;
        }
        else {
          pdVar7 = (double *)infinity();
          local_2b8 = *pdVar7;
        }
        local_88 = local_2b8;
      }
      dVar16 = local_70;
      local_be = false;
      pdVar7 = (double *)infinity();
      dVar14 = local_78;
      if ((-*pdVar7 < dVar16) || (pdVar7 = (double *)infinity(), dVar14 < *pdVar7)) {
        dVar16 = local_80;
        pdVar7 = (double *)infinity();
        dVar14 = local_88;
        if ((-*pdVar7 < dVar16) || (pdVar7 = (double *)infinity(), dVar14 < *pdVar7)) {
          psVar3 = local_50;
          dVar14 = local_70;
          SPxSimplifier<double>::tolerances((SPxSimplifier<double> *)__p);
          peVar9 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x28160c);
          local_e1 = 0;
          RVar12 = Tolerances::epsilon(peVar9);
          bVar5 = LE<double,double,double>(dVar14,(double)psVar3,RVar12);
          dVar16 = local_58;
          dVar14 = local_78;
          local_34a = false;
          if (bVar5) {
            SPxSimplifier<double>::tolerances((SPxSimplifier<double> *)__p);
            local_e1 = 1;
            peVar9 = std::
                     __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2816c0);
            RVar12 = Tolerances::epsilon(peVar9);
            local_34a = GE<double,double,double>(dVar14,dVar16,RVar12);
          }
          if ((local_e1 & 1) != 0) {
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x281733);
          }
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x281740);
          psVar3 = local_60;
          dVar14 = local_80;
          if (local_34a == false) {
            SPxSimplifier<double>::tolerances((SPxSimplifier<double> *)__p);
            peVar9 = std::
                     __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x281a3d);
            local_131 = 0;
            RVar12 = Tolerances::epsilon(peVar9);
            bVar5 = LE<double,double,double>(dVar14,(double)psVar3,RVar12);
            dVar16 = local_68;
            dVar14 = local_88;
            local_3f2 = false;
            if (bVar5) {
              SPxSimplifier<double>::tolerances((SPxSimplifier<double> *)__p);
              local_131 = 1;
              peVar9 = std::
                       __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x281af1);
              RVar12 = Tolerances::epsilon(peVar9);
              local_3f2 = GE<double,double,double>(dVar14,dVar16,RVar12);
            }
            if ((local_131 & 1) != 0) {
              std::shared_ptr<soplex::Tolerances>::~shared_ptr
                        ((shared_ptr<soplex::Tolerances> *)0x281b64);
            }
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x281b71);
            if (local_3f2 == false) {
              RVar12 = spxAbs<double>(local_40);
              RVar13 = spxAbs<double>(local_48);
              local_be = RVar12 <= RVar13;
            }
            else {
              local_be = true;
            }
          }
          else {
            SPxSimplifier<double>::tolerances((SPxSimplifier<double> *)__p);
            peVar9 = std::
                     __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x28179e);
            local_109 = 0;
            RVar12 = Tolerances::epsilon(peVar9);
            bVar5 = LE<double,double,double>(dVar14,(double)psVar3,RVar12);
            dVar16 = local_68;
            dVar14 = local_88;
            local_39a = false;
            if (bVar5) {
              SPxSimplifier<double>::tolerances((SPxSimplifier<double> *)__p);
              local_109 = 1;
              peVar9 = std::
                       __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x281852);
              RVar12 = Tolerances::epsilon(peVar9);
              local_39a = GE<double,double,double>(dVar14,dVar16,RVar12);
            }
            if ((local_109 & 1) != 0) {
              std::shared_ptr<soplex::Tolerances>::~shared_ptr
                        ((shared_ptr<soplex::Tolerances> *)0x2818c5);
            }
            std::shared_ptr<soplex::Tolerances>::~shared_ptr
                      ((shared_ptr<soplex::Tolerances> *)0x2818d2);
            if (local_39a == false) {
              local_be = false;
            }
            else {
              RVar12 = spxAbs<double>(local_40);
              RVar13 = spxAbs<double>(local_48);
              local_be = RVar12 <= RVar13;
            }
          }
        }
        else {
          local_be = false;
        }
      }
      else {
        local_be = true;
      }
      uVar4 = local_38._4_4_;
      dVar16 = local_40;
      psVar3 = local_50;
      dVar14 = local_58;
      if (local_be != false) {
        local_138 = local_38._4_4_;
        local_140 = local_40;
        local_148 = local_50;
        local_150 = local_58;
        local_38._4_4_ = local_38._0_4_;
        local_38._0_4_ = uVar4;
        local_40 = local_48;
        local_48 = dVar16;
        local_50 = local_60;
        local_60 = psVar3;
        local_58 = local_68;
        local_68 = dVar14;
      }
      local_158 = SPxLPBase<double>::colVector(this_00,(int)((ulong)__p >> 0x20));
      local_160 = SPxLPBase<double>::colVector(this_00,(int)((ulong)__p >> 0x20));
      local_168 = -(local_48 / local_40);
      local_170 = (double)local_38._8_8_ / local_40;
      SPxOut::
      debug<soplex::SPxMainSM<double>,_const_char_(&)[46],_int_&,_double_&,_double_&,_int_&,_0>
                (in_RDI,(char (*) [46])" removed, replacing x_{} with {} + {} * x_{}\n",
                 (int *)(local_38 + 4),&local_170,&local_168,(int *)local_38);
      for (local_174 = 0; uVar1 = local_174, iVar6 = SVectorBase<double>::size(local_158),
          (int)uVar1 < iVar6; local_174 = local_174 + 1) {
        pcVar8 = SVectorBase<double>::index(local_158,(char *)(ulong)local_174,__c_01);
        local_178 = (uint)pcVar8;
        pdVar7 = SVectorBase<double>::value(local_158,local_174);
        local_180 = *pdVar7;
        if (local_178 != *local_28) {
          pdVar7 = SPxLPBase<double>::lhs(this_00,(int)((ulong)__p >> 0x20));
          local_188 = *pdVar7;
          pdVar7 = SPxLPBase<double>::rhs(this_00,(int)((ulong)__p >> 0x20));
          dVar14 = local_188;
          local_190 = (AggregationPS *)*pdVar7;
          pdVar7 = (double *)infinity();
          if (-*pdVar7 < dVar14) {
            local_198 = local_188 - local_170 * local_180;
            (*(local_18._M_pi)->_vptr__Sp_counted_base[0x33])
                      (local_18._M_pi,(ulong)local_178,&local_198,0);
            (in_RDI->super_SPxSimplifier<double>).m_chgLRhs =
                 (in_RDI->super_SPxSimplifier<double>).m_chgLRhs + 1;
          }
          in_stack_fffffffffffffbc0 = local_190;
          pdVar7 = (double *)infinity();
          if ((double)in_stack_fffffffffffffbc0 < *pdVar7) {
            local_1a0 = (double)local_190 - local_170 * local_180;
            (*(local_18._M_pi)->_vptr__Sp_counted_base[0x36])
                      (local_18._M_pi,(ulong)local_178,&local_1a0,0);
            (in_RDI->super_SPxSimplifier<double>).m_chgLRhs =
                 (in_RDI->super_SPxSimplifier<double>).m_chgLRhs + 1;
          }
          local_1a8 = local_168 * local_180;
          local_1ac = SVectorBase<double>::pos
                                (in_stack_fffffffffffffaf8,(int)((ulong)this_00 >> 0x20));
          if (-1 < local_1ac) {
            pdVar7 = SVectorBase<double>::value(local_160,local_1ac);
            local_1b8 = *pdVar7;
            local_1a8 = local_1b8 + local_1a8;
            (in_RDI->super_SPxSimplifier<double>).m_remNzos =
                 (in_RDI->super_SPxSimplifier<double>).m_remNzos + 1;
          }
          (*(local_18._M_pi)->_vptr__Sp_counted_base[0x43])
                    (local_18._M_pi,(ulong)local_178,(ulong)(uint)local_38._0_4_,&local_1a8,0);
        }
      }
      lp_01 = (SPxLPBase<double> *)
              SPxLPBase<double>::obj
                        (in_stack_fffffffffffffb00,(int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
      local_1c0 = lp_01;
      epsZero((SPxMainSM<double> *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
      bVar5 = isNotZero<double,double>((double)this_00,(double)__p);
      if (bVar5) {
        (*(in_RDI->super_SPxSimplifier<double>)._vptr_SPxSimplifier[0x11])
                  (local_170 * (double)local_1c0);
        local_1c8 = SPxLPBase<double>::obj
                              (in_stack_fffffffffffffb00,
                               (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
        local_1d0 = local_1c8 + local_168 * (double)local_1c0;
        (*(local_18._M_pi)->_vptr__Sp_counted_base[0x24])
                  (local_18._M_pi,(ulong)(uint)local_38._0_4_,&local_1d0,0);
      }
      local_1d8 = maxAbs((Real)in_stack_fffffffffffffb00,(Real)in_stack_fffffffffffffaf8);
      local_1e0 = maxAbs((Real)in_stack_fffffffffffffb00,(Real)in_stack_fffffffffffffaf8);
      if (local_1d8 < 1.0) {
        local_1d8 = 1.0;
      }
      if (local_1e0 < 1.0) {
        local_1e0 = 1.0;
      }
      dVar14 = (double)local_38._8_8_ / local_1d8 - (local_40 * local_58) / local_1d8;
      local_1f0 = (double)local_38._8_8_ / local_1e0 - (local_40 * (double)local_50) / local_1e0;
      local_1e8 = dVar14;
      epsZero((SPxMainSM<double> *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
      bVar5 = isZero<double,double>((double)this_00,(double)__p);
      if (bVar5) {
        local_1e8 = 0.0;
      }
      dVar16 = local_1f0;
      epsZero((SPxMainSM<double> *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
      bVar5 = isZero<double,double>((double)this_00,(double)__p);
      psVar3 = local_50;
      if (bVar5) {
        local_1f0 = 0.0;
      }
      if (local_48 * local_40 <= 0.0) {
        if (0.0 <= local_48 * local_40) {
          uVar10 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_210,"XMAISM12 This should never happen.",&local_211);
          SPxInternalCodeException::SPxInternalCodeException
                    ((SPxInternalCodeException *)this_00,(string *)__p);
          __cxa_throw(uVar10,&SPxInternalCodeException::typeinfo,
                      SPxInternalCodeException::~SPxInternalCodeException);
        }
        pdVar7 = (double *)infinity();
        if (-*pdVar7 < (double)psVar3) {
          local_488 = (local_1f0 * local_1e0) / local_48;
        }
        else {
          pdVar7 = (double *)infinity();
          local_488 = -*pdVar7;
        }
        dVar2 = local_58;
        local_80 = local_488;
        pdVar7 = (double *)infinity();
        if (dVar2 < *pdVar7) {
          local_498 = (local_1e8 * local_1d8) / local_48;
        }
        else {
          pdVar7 = (double *)infinity();
          local_498 = *pdVar7;
        }
        local_88 = local_498;
      }
      else {
        in_stack_fffffffffffffba0 = local_58;
        pdVar7 = (double *)infinity();
        if (in_stack_fffffffffffffba0 < *pdVar7) {
          in_stack_fffffffffffffb98 = (local_1e8 * local_1d8) / local_48;
        }
        else {
          pdVar7 = (double *)infinity();
          in_stack_fffffffffffffb98 = -*pdVar7;
        }
        in_stack_fffffffffffffb90 = local_50;
        local_80 = in_stack_fffffffffffffb98;
        pdVar7 = (double *)infinity();
        if (-*pdVar7 < (double)in_stack_fffffffffffffb90) {
          local_478 = (local_1f0 * local_1e0) / local_48;
        }
        else {
          pdVar7 = (double *)infinity();
          local_478 = *pdVar7;
        }
        local_88 = local_478;
      }
      psVar3 = local_60;
      dVar2 = local_80;
      dVar15 = epsZero((SPxMainSM<double> *)
                       CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
      bVar5 = GT<double,double,double>(dVar2,(double)psVar3,dVar15);
      if (bVar5) {
        (*(local_18._M_pi)->_vptr__Sp_counted_base[0x2a])
                  (local_18._M_pi,(ulong)(uint)local_38._0_4_,&local_80,0);
        (in_RDI->super_SPxSimplifier<double>).m_chgBnds =
             (in_RDI->super_SPxSimplifier<double>).m_chgBnds + 1;
      }
      dVar15 = local_68;
      dVar2 = local_88;
      eps = epsZero((SPxMainSM<double> *)
                    CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
      bVar5 = LT<double,double,double>(dVar2,dVar15,eps);
      if (bVar5) {
        (*(local_18._M_pi)->_vptr__Sp_counted_base[0x2d])
                  (local_18._M_pi,(ulong)(uint)local_38._0_4_,&local_88,0);
        (in_RDI->super_SPxSimplifier<double>).m_chgBnds =
             (in_RDI->super_SPxSimplifier<double>).m_chgBnds + 1;
      }
      lp_00 = (SPxMainSM<double> *)operator_new(0xa8);
      this_01 = lp_00;
      std::shared_ptr<soplex::Tolerances>::shared_ptr
                ((shared_ptr<soplex::Tolerances> *)this_00,(shared_ptr<soplex::Tolerances> *)__p);
      AggregationPS::AggregationPS
                (in_stack_fffffffffffffbc0,lp_01,(int)((ulong)dVar14 >> 0x20),SUB84(dVar14,0),dVar16
                 ,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
      std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::
      shared_ptr<soplex::SPxMainSM<double>::AggregationPS,void>
                ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)this_00,__p);
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x28283a);
      Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::append
                ((Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *)this_00,
                 (shared_ptr<soplex::SPxMainSM<double>::PostStep> *)__p);
      iVar6 = (int)((ulong)this_00 >> 0x20);
      removeRow(this_01,(SPxLPBase<double> *)lp_00,iVar6);
      removeCol(this_01,(SPxLPBase<double> *)lp_00,iVar6);
      (in_RDI->super_SPxSimplifier<double>).m_remRows =
           (in_RDI->super_SPxSimplifier<double>).m_remRows + 1;
      (in_RDI->super_SPxSimplifier<double>).m_remCols =
           (in_RDI->super_SPxSimplifier<double>).m_remCols + 1;
      (in_RDI->super_SPxSimplifier<double>).m_remNzos =
           (in_RDI->super_SPxSimplifier<double>).m_remNzos + 2;
      piVar11 = DataArray<int>::operator[](&in_RDI->m_stat,0xf);
      *piVar11 = *piVar11 + 1;
      local_4 = OKAY;
      std::shared_ptr<soplex::SPxMainSM<double>::PostStep>::~shared_ptr
                ((shared_ptr<soplex::SPxMainSM<double>::PostStep> *)0x2828ea);
      return local_4;
    }
  }
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::aggregateVars(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 2);
   assert(EQrel(lp.lhs(i), lp.rhs(i), feastol()));

   R rhs = lp.rhs(i);
   assert(rhs < R(infinity) && rhs > R(-infinity));

   int j = row.index(0);
   int k = row.index(1);
   R aij = row.value(0);
   R aik = row.value(1);
   R lower_j = lp.lower(j);
   R upper_j = lp.upper(j);
   R lower_k = lp.lower(k);
   R upper_k = lp.upper(k);

   // fixed variables should be removed by simplifyCols()
   if(EQrel(lower_j, upper_j, feastol()) || EQrel(lower_k, upper_k, feastol()))
      return this->OKAY;

   assert(isNotZero(aij, this->epsZero()) && isNotZero(aik, this->epsZero()));

   SPxOut::debug(this, "IMAISM23 row {}: doubleton equation -> {} x_{} + {} x_{} = {}", i, aij, j, aik,
                 k, rhs);

   // determine which variable can be aggregated without requiring bound tightening of the other variable
   R new_lo_j;
   R new_up_j;
   R new_lo_k;
   R new_up_k;

   if(aij * aik < 0.0)
   {
      // orientation persists
      new_lo_j = (upper_k >=  R(infinity)) ? R(-infinity) : (rhs - aik * upper_k) / aij;
      new_up_j = (lower_k <= R(-infinity)) ?  R(infinity) : (rhs - aik * lower_k) / aij;
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : (rhs - aij * upper_j) / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : (rhs - aij * lower_j) / aik;
   }
   else if(aij * aik > 0.0)
   {
      // orientation is reversed
      new_lo_j = (lower_k <= R(-infinity)) ? R(-infinity) : (rhs - aik * lower_k) / aij;
      new_up_j = (upper_k >=  R(infinity)) ?  R(infinity) : (rhs - aik * upper_k) / aij;
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : (rhs - aij * lower_j) / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : (rhs - aij * upper_j) / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   bool flip_jk = false;

   if(new_lo_j <= R(-infinity) && new_up_j >= R(infinity))
   {
      // no bound tightening on x_j when x_k is aggregated
      flip_jk = true;
   }
   else if(new_lo_k <= R(-infinity) && new_up_k >= R(infinity))
   {
      // no bound tightening on x_k when x_j is aggregated
      flip_jk = false;
   }
   else if(LE(new_lo_j, lower_j, this->tolerances()->epsilon())
           && GE(new_up_j, upper_j, this->tolerances()->epsilon()))
   {
      if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
            && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
      {
         // both variables' bounds are not affected by aggregation; choose the better aggregation coeff (aik/aij)
         if(spxAbs(aij) > spxAbs(aik))
            flip_jk = false;
         else
            flip_jk = true;
      }
      else
         flip_jk = false;
   }
   else if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
           && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
   {
      flip_jk = true;
   }
   else
   {
      if(spxAbs(aij) > spxAbs(aik))
         flip_jk = false;
      else
         flip_jk = true;
   }

   if(flip_jk)
   {
      int _j = j;
      R _aij = aij;
      R _lower_j = lower_j;
      R _upper_j = upper_j;
      j = k;
      k = _j;
      aij = aik;
      aik = _aij;
      lower_j = lower_k;
      lower_k = _lower_j;
      upper_j = upper_k;
      upper_k = _upper_j;
   }

   const SVectorBase<R>& col_j = lp.colVector(j);
   const SVectorBase<R>& col_k = lp.colVector(k);

   // aggregation coefficients (x_j = aggr_coef * x_k + aggr_const)
   R aggr_coef = - (aik / aij);
   R aggr_const = rhs / aij;

   SPxOut::debug(this, " removed, replacing x_{} with {} + {} * x_{}\n", j, aggr_const, aggr_coef, k);

   // replace all occurrences of x_j
   for(int r = 0; r < col_j.size(); ++r)
   {
      int row_r = col_j.index(r);
      R arj = col_j.value(r);

      // skip row i
      if(row_r == i)
         continue;

      // adapt sides of row r
      R lhs_r = lp.lhs(row_r);
      R rhs_r = lp.rhs(row_r);

      if(lhs_r > R(-infinity))
      {
         lp.changeLhs(row_r, lhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      if(rhs_r < R(infinity))
      {
         lp.changeRhs(row_r, rhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      R newcoef = aggr_coef * arj;
      int pos_rk = col_k.pos(row_r);

      // check whether x_k is also present in row r and get its coefficient
      if(pos_rk >= 0)
      {
         R ark = col_k.value(pos_rk);
         newcoef += ark;
         this->m_remNzos++;
      }

      // add new column k to row r or adapt the coefficient a_rk
      lp.changeElement(row_r, k, newcoef);
   }

   // adapt objective function
   R obj_j = lp.obj(j);

   if(isNotZero(obj_j, this->epsZero()))
   {
      this->addObjoffset(aggr_const * obj_j);
      R obj_k = lp.obj(k);
      lp.changeObj(k, obj_k + aggr_coef * obj_j);
   }

   // adapt bounds of x_k
   R scale1 = maxAbs(rhs, aij * upper_j);
   R scale2 = maxAbs(rhs, aij * lower_j);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (rhs / scale1) - (aij * upper_j / scale1);
   R z2 = (rhs / scale2) - (aij * lower_j / scale2);

   // just some rounding
   if(isZero(z1, this->epsZero()))
      z1 = 0.0;

   if(isZero(z2, this->epsZero()))
      z2 = 0.0;

   // determine which side has to be used for the bounds comparison below
   if(aik * aij > 0.0)
   {
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : z1 * scale1 / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : z2 * scale2 / aik;
   }
   else if(aik * aij < 0.0)
   {
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : z2 * scale2 / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : z1 * scale1 / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   // change bounds of x_k if the new ones are tighter
   R oldlower_k = lower_k;
   R oldupper_k = upper_k;

   if(GT(new_lo_k, lower_k, this->epsZero()))
   {
      lp.changeLower(k, new_lo_k);
      this->m_chgBnds++;
   }

   if(LT(new_up_k, upper_k, this->epsZero()))
   {
      lp.changeUpper(k, new_up_k);
      this->m_chgBnds++;
   }

   std::shared_ptr<PostStep> ptr(new AggregationPS(lp, i, j, rhs, oldupper_k, oldlower_k,
                                 this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);
   removeCol(lp, j);

   this->m_remRows++;
   this->m_remCols++;
   this->m_remNzos += 2;

   ++m_stat[AGGREGATION];

   return this->OKAY;
}